

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  JSAMPROW pJVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  iVar5 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  uVar12 = (uint)*(byte *)((long)&cinfo->downsample[6].start_pass + (long)compptr->component_index);
  bVar1 = *(byte *)((long)&cinfo->downsample[6].downsample + (long)compptr->component_index + 2);
  uVar4 = (ulong)bVar1;
  uVar14 = (ulong)cinfo->max_v_samp_factor;
  if (0 < (long)uVar14) {
    uVar2 = cinfo->image_width;
    if (0 < (int)(iVar5 * uVar12 - uVar2)) {
      uVar11 = 0;
      do {
        memset(input_data[uVar11] + uVar2,(uint)input_data[uVar11][(ulong)uVar2 - 1],
               (ulong)(iVar5 * uVar12 + ~uVar2) + 1);
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
      uVar14 = (ulong)(uint)cinfo->max_v_samp_factor;
    }
  }
  if (0 < (int)uVar14) {
    uVar2 = bVar1 * uVar12;
    lVar7 = 0;
    lVar8 = 0;
    do {
      if (iVar5 != 0) {
        pJVar9 = output_data[lVar7];
        uVar13 = 0;
        iVar10 = 0;
        do {
          if (uVar4 == 0) {
            lVar3 = 0;
          }
          else {
            uVar14 = 0;
            lVar3 = 0;
            do {
              if (uVar12 != 0) {
                lVar6 = 0;
                do {
                  lVar3 = lVar3 + (ulong)input_data[lVar8 + uVar14][lVar6 + (ulong)uVar13];
                  lVar6 = lVar6 + 1;
                } while (uVar12 != (uint)lVar6);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar4);
          }
          *pJVar9 = (JSAMPLE)((long)(lVar3 + (ulong)(uVar2 >> 1)) / (long)(ulong)uVar2);
          pJVar9 = pJVar9 + 1;
          iVar10 = iVar10 + 1;
          uVar13 = uVar13 + uVar12;
        } while (iVar10 != iVar5);
        uVar14 = (ulong)(uint)cinfo->max_v_samp_factor;
      }
      lVar8 = lVar8 + uVar4;
      lVar7 = lVar7 + 1;
    } while (lVar8 < (int)uVar14);
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  my_downsample_ptr downsample = (my_downsample_ptr) cinfo->downsample;
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;	/* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  JSAMPROW inptr, outptr;
  INT32 outvalue;

  h_expand = downsample->h_expand[compptr->component_index];
  v_expand = downsample->v_expand[compptr->component_index];
  numpix = h_expand * v_expand;
  numpix2 = numpix/2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * h_expand);

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
	 outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
	inptr = input_data[inrow+v] + outcol_h;
	for (h = 0; h < h_expand; h++) {
	  outvalue += (INT32) GETJSAMPLE(*inptr++);
	}
      }
      *outptr++ = (JSAMPLE) ((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
    outrow++;
  }
}